

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O1

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::visitExpr
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this,CallExpression *expr)

{
  __index_type _Var1;
  size_t sVar2;
  pointer ppEVar3;
  Expression *this_00;
  long *plVar4;
  char cVar5;
  Subroutine *pSVar6;
  long lVar7;
  long lVar8;
  
  ast::CallExpression::visitExprsNoArgs<slang::analysis::DataFlowAnalysis&>
            (expr,(DataFlowAnalysis *)this);
  _Var1 = *(__index_type *)
           ((long)&(expr->subroutine).
                   super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                   .
                   super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                   .
                   super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                   .
                   super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                   .
                   super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                   .
                   super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
           + 0x30);
  pSVar6 = (Subroutine *)0x0;
  if (_Var1 == '\x01') {
    pSVar6 = &expr->subroutine;
  }
  sVar2 = (expr->arguments_)._M_extent._M_extent_value;
  if (sVar2 != 0) {
    ppEVar3 = (expr->arguments_)._M_ptr;
    lVar7 = sVar2 << 3;
    lVar8 = 0;
    do {
      this_00 = ppEVar3[lVar8];
      if (_Var1 == '\x01') {
        plVar4 = *(long **)&(pSVar6->
                            super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                            ).
                            super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                            .
                            super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                            .
                            super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                            .
                            super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                            .
                            super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                            ._M_u;
        cVar5 = (**(code **)(*plVar4 + 0x20))(plVar4,lVar8);
        if (cVar5 == '\0') goto LAB_002da328;
      }
      else {
LAB_002da328:
        ast::Expression::
        visitExpression<slang::ast::Expression_const,slang::analysis::DataFlowAnalysis&>
                  (this_00,this_00,(DataFlowAnalysis *)this);
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + -8;
    } while (lVar7 != 0);
  }
  if ((_Var1 == '\x01') &&
     (*(char *)(*(long *)&(pSVar6->
                          super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          ).
                          super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          .
                          super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          .
                          super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          .
                          super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          .
                          super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          ._M_u + 0x31) == '\x01')) {
    setUnreachable(this);
    return;
  }
  return;
}

Assistant:

void visitExpr(const CallExpression& expr) {
        expr.visitExprsNoArgs(DERIVED);

        auto sysCall = std::get_if<CallExpression::SystemCallInfo>(&expr.subroutine);
        size_t argIndex = 0;
        for (auto arg : expr.arguments()) {
            if (!sysCall || !sysCall->subroutine->isArgUnevaluated(argIndex))
                visit(*arg);
            argIndex++;
        }

        if (sysCall && sysCall->subroutine->neverReturns)
            setUnreachable();
    }